

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O2

void __thiscall
jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::shrink_to_fit
          (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this)

{
  byte bVar1;
  object *this_00;
  
  for (; bVar1 = (byte)*(object_storage *)this & 0xf, bVar1 == 9;
      this = *(basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> **)((long)this + 8))
  {
  }
  if (bVar1 != 0xd) {
    if (bVar1 == 0xe) {
      json_array<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::vector>
      ::shrink_to_fit(*(json_array<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::vector>
                        **)((long)this + 8));
      return;
    }
    return;
  }
  this_00 = basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::object_storage::
            value_abi_cxx11_((object_storage *)this);
  sorted_json_object<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::vector>
  ::shrink_to_fit(this_00);
  return;
}

Assistant:

void shrink_to_fit()
        {
            switch (storage_kind())
            {
                case json_storage_kind::array:
                    cast<array_storage>().value().shrink_to_fit();
                    break;
                case json_storage_kind::object:
                    cast<object_storage>().value().shrink_to_fit();
                    break;
                case json_storage_kind::json_reference:
                    cast<json_reference_storage>().value().shrink_to_fit();
                    break;
                default:
                    break;
            }
        }